

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

bool kratos::is_valid_verilog(string *src)

{
  int iVar1;
  runtime_error *prVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined1 local_318 [8];
  ofstream f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [14];
  ios_base local_220 [264];
  undefined1 auStack_118 [8];
  string output_filename;
  long local_e8;
  undefined1 local_d8 [8];
  string pathname;
  string verilator;
  string filename;
  string iverilog;
  long local_48;
  pointer pcStack_40;
  pointer local_38;
  pointer pcStack_30;
  
  pathname._M_string_length._0_4_ = 0x706d742f;
  pathname._M_dataplus._M_p = (pointer)0x4;
  pathname._M_string_length._4_4_ = pathname._M_string_length._4_4_ & 0xffffff00;
  local_318 = (undefined1  [8])local_308;
  local_d8 = (undefined1  [8])&pathname._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"src.sv","");
  fs::join((string *)((long)&verilator.field_2 + 8),(string *)local_d8,(string *)local_318);
  if (local_318 != (undefined1  [8])local_308) {
    operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
  }
  if (filename._M_dataplus._M_p == (pointer)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"unable to create temp file");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ofstream::ofstream(local_318,(string *)(verilator.field_2._M_local_buf + 8),_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_318,(src->_M_dataplus)._M_p,src->_M_string_length);
  std::ofstream::close();
  iverilog.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&iverilog.field_2 + 8),"verilator","");
  fs::which((string *)((long)&pathname.field_2 + 8),(string *)((long)&iverilog.field_2 + 8));
  if ((long *)iverilog.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)iverilog.field_2._8_8_,local_48 + 1);
  }
  if (verilator._M_dataplus._M_p == (pointer)0x0) {
    iverilog.field_2._8_8_ = &stack0xffffffffffffffb8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&iverilog.field_2 + 8),"iverilog","");
    fs::which((string *)((long)&filename.field_2 + 8),(string *)((long)&iverilog.field_2 + 8));
    if ((long *)iverilog.field_2._8_8_ != &stack0xffffffffffffffb8) {
      operator_delete((void *)iverilog.field_2._8_8_,local_48 + 1);
    }
    if (iverilog._M_dataplus._M_p == (pointer)0x0) {
      remove((char *)verilator.field_2._8_8_);
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"iverilog and verilator not found in the system");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iverilog.field_2._8_8_ = &stack0xffffffffffffffb8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&iverilog.field_2 + 8),"out.a","");
    fs::join((string *)auStack_118,(string *)local_d8,(string *)((long)&iverilog.field_2 + 8));
    if ((long *)iverilog.field_2._8_8_ != &stack0xffffffffffffffb8) {
      operator_delete((void *)iverilog.field_2._8_8_,local_48 + 1);
    }
    iverilog.field_2._8_8_ = filename.field_2._8_8_;
    local_48 = verilator.field_2._8_8_;
    pcStack_40 = filename._M_dataplus._M_p;
    local_38 = (pointer)auStack_118;
    pcStack_30 = output_filename._M_dataplus._M_p;
    format_str_00.size_ = 0xddd;
    format_str_00.data_ = (char *)0xe;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)((long)&iverilog.field_2 + 8);
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&output_filename.field_2 + 8),(detail *)"{0} {1} -o {2}",
               format_str_00,args_00);
    iVar1 = system((char *)output_filename.field_2._8_8_);
    if ((long *)output_filename.field_2._8_8_ != &stack0xffffffffffffff18) {
      operator_delete((void *)output_filename.field_2._8_8_,local_e8 + 1);
    }
    remove((char *)verilator.field_2._8_8_);
    if (auStack_118 != (undefined1  [8])&output_filename._M_string_length) {
      operator_delete((void *)auStack_118,output_filename._M_string_length + 1);
    }
    if ((size_type *)filename.field_2._8_8_ != &iverilog._M_string_length) {
      operator_delete((void *)filename.field_2._8_8_,iverilog._M_string_length + 1);
    }
  }
  else {
    iverilog.field_2._8_8_ = pathname.field_2._8_8_;
    local_48 = verilator.field_2._8_8_;
    pcStack_40 = filename._M_dataplus._M_p;
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x1e;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)((long)&iverilog.field_2 + 8);
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&filename.field_2 + 8),(detail *)"{0} {1} --lint-only -Wno-fatal",
               format_str,args);
    iVar1 = system((char *)filename.field_2._8_8_);
    if ((size_type *)filename.field_2._8_8_ != &iverilog._M_string_length) {
      operator_delete((void *)filename.field_2._8_8_,iverilog._M_string_length + 1);
    }
    remove((char *)verilator.field_2._8_8_);
  }
  if ((size_type *)pathname.field_2._8_8_ != &verilator._M_string_length) {
    operator_delete((void *)pathname.field_2._8_8_,verilator._M_string_length + 1);
  }
  local_318 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_318 + *(long *)(_VTT + -0x18)) = _pthread_mutex_unlock;
  std::filebuf::~filebuf((filebuf *)&f);
  std::ios_base::~ios_base(local_220);
  if ((size_type *)verilator.field_2._8_8_ != &filename._M_string_length) {
    operator_delete((void *)verilator.field_2._8_8_,filename._M_string_length + 1);
  }
  if (local_d8 != (undefined1  [8])&pathname._M_string_length) {
    operator_delete((void *)local_d8,
                    CONCAT44(pathname._M_string_length._4_4_,(undefined4)pathname._M_string_length)
                    + 1);
  }
  return iVar1 == 0;
}

Assistant:

bool is_valid_verilog(const std::string &src) {
    // we first output to a temp src
    std::string pathname = fs::temp_directory_path();
    std::string filename = fs::join(pathname, "src.sv");
    if (filename.empty()) throw std::runtime_error("unable to create temp file");
    std::ofstream f(filename);
    f << src;
    f.close();

    int status;

    // choose which parser to use
    // we use verilator first
    std::string verilator = fs::which("verilator");
    if (!verilator.empty()) {
        status =
            std::system(::format("{0} {1} --lint-only -Wno-fatal", verilator, filename).c_str());
        fs::remove(filename);
        return status == 0;
    }

    std::string iverilog = fs::which("iverilog");
    if (!iverilog.empty()) {
        std::string output_filename = fs::join(pathname, "out.a");
        status =
            std::system(::format("{0} {1} -o {2}", iverilog, filename, output_filename).c_str());
        fs::remove(filename);
        return status == 0;
    }

    fs::remove(filename);
    throw std::runtime_error("iverilog and verilator not found in the system");
}